

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<bool>::resize(QList<bool> *this,qsizetype size)

{
  bool *pbVar1;
  Data *pDVar2;
  long lVar3;
  bool *pbVar4;
  bool *__s;
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((long)((((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
             (pDVar2->super_QArrayData).alloc) - (long)(this->d).ptr) < size)) {
    QArrayDataPointer<bool>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(bool **)0x0,(QArrayDataPointer<bool> *)0x0
              );
    lVar3 = (this->d).size;
  }
  else {
    lVar3 = (this->d).size;
    if (size < lVar3) goto LAB_0010f307;
  }
  if (size <= lVar3) {
    return;
  }
  pbVar4 = (this->d).ptr;
  pbVar1 = pbVar4 + lVar3;
  __s = pbVar1 + 1;
  pbVar4 = pbVar4 + size;
  *pbVar1 = false;
  if (__s != pbVar4) {
    memset(__s,0,(long)pbVar4 - (long)__s);
  }
LAB_0010f307:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }